

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_arm_shift_im(TCGContext_conflict1 *tcg_ctx,TCGv_i32 var,int shiftop,int shift,int flags)

{
  TCGv_i32 ret;
  TCGv_i32 tmp;
  int local_20;
  int flags_local;
  int shift_local;
  int shiftop_local;
  TCGv_i32 var_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  switch(shiftop) {
  case 0:
    if (shift != 0) {
      if (flags != 0) {
        shifter_out_im(tcg_ctx,var,0x20 - shift);
      }
      tcg_gen_shli_i32_aarch64(tcg_ctx,var,var,shift);
    }
    break;
  case 1:
    if (shift == 0) {
      if (flags != 0) {
        tcg_gen_shri_i32_aarch64(tcg_ctx,tcg_ctx->cpu_CF,var,0x1f);
      }
      tcg_gen_movi_i32(tcg_ctx,var,0);
    }
    else {
      if (flags != 0) {
        shifter_out_im(tcg_ctx,var,shift + -1);
      }
      tcg_gen_shri_i32_aarch64(tcg_ctx,var,var,shift);
    }
    break;
  case 2:
    local_20 = shift;
    if (shift == 0) {
      local_20 = 0x20;
    }
    if (flags != 0) {
      shifter_out_im(tcg_ctx,var,local_20 + -1);
    }
    if (local_20 == 0x20) {
      local_20 = 0x1f;
    }
    tcg_gen_sari_i32_aarch64(tcg_ctx,var,var,local_20);
    break;
  case 3:
    if (shift == 0) {
      ret = tcg_temp_new_i32(tcg_ctx);
      tcg_gen_shli_i32_aarch64(tcg_ctx,ret,tcg_ctx->cpu_CF,0x1f);
      if (flags != 0) {
        shifter_out_im(tcg_ctx,var,0);
      }
      tcg_gen_shri_i32_aarch64(tcg_ctx,var,var,1);
      tcg_gen_or_i32(tcg_ctx,var,var,ret);
      tcg_temp_free_i32(tcg_ctx,ret);
    }
    else {
      if (flags != 0) {
        shifter_out_im(tcg_ctx,var,shift + -1);
      }
      tcg_gen_rotri_i32_aarch64(tcg_ctx,var,var,shift);
    }
  }
  return;
}

Assistant:

static inline void gen_arm_shift_im(TCGContext *tcg_ctx, TCGv_i32 var, int shiftop,
                                    int shift, int flags)
{
    switch (shiftop) {
    case 0: /* LSL */
        if (shift != 0) {
            if (flags)
                shifter_out_im(tcg_ctx, var, 32 - shift);
            tcg_gen_shli_i32(tcg_ctx, var, var, shift);
        }
        break;
    case 1: /* LSR */
        if (shift == 0) {
            if (flags) {
                tcg_gen_shri_i32(tcg_ctx, tcg_ctx->cpu_CF, var, 31);
            }
            tcg_gen_movi_i32(tcg_ctx, var, 0);
        } else {
            if (flags)
                shifter_out_im(tcg_ctx, var, shift - 1);
            tcg_gen_shri_i32(tcg_ctx, var, var, shift);
        }
        break;
    case 2: /* ASR */
        if (shift == 0)
            shift = 32;
        if (flags)
            shifter_out_im(tcg_ctx, var, shift - 1);
        if (shift == 32)
          shift = 31;
        tcg_gen_sari_i32(tcg_ctx, var, var, shift);
        break;
    case 3: /* ROR/RRX */
        if (shift != 0) {
            if (flags)
                shifter_out_im(tcg_ctx, var, shift - 1);
            tcg_gen_rotri_i32(tcg_ctx, var, var, shift); break;
        } else {
            TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_shli_i32(tcg_ctx, tmp, tcg_ctx->cpu_CF, 31);
            if (flags)
                shifter_out_im(tcg_ctx, var, 0);
            tcg_gen_shri_i32(tcg_ctx, var, var, 1);
            tcg_gen_or_i32(tcg_ctx, var, var, tmp);
            tcg_temp_free_i32(tcg_ctx, tmp);
        }
    }
}